

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonReplaceFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  uchar *puVar2;
  JsonNode *pJVar3;
  ulong uVar4;
  JsonParse x;
  
  if (0 < argc) {
    if ((argc & 1U) == 0) {
      jsonWrongNumArgs(ctx,"replace");
      return;
    }
    puVar2 = sqlite3_value_text(*argv);
    iVar1 = jsonParse(&x,ctx,(char *)puVar2);
    if (iVar1 == 0) {
      for (uVar4 = 1; uVar4 < (uint)argc; uVar4 = uVar4 + 2) {
        puVar2 = sqlite3_value_text(argv[uVar4]);
        pJVar3 = jsonLookup(&x,(char *)puVar2,(int *)0x0,ctx);
        if (x.nErr != '\0') goto LAB_001b4986;
        if (pJVar3 != (JsonNode *)0x0) {
          pJVar3->jnFlags = pJVar3->jnFlags | 8;
          (pJVar3->u).iAppend = (int)uVar4 + 1;
        }
      }
      if (((x.aNode)->jnFlags & 8) == 0) {
        jsonReturnJson(x.aNode,ctx,argv);
      }
      else {
        sqlite3_result_value(ctx,argv[((x.aNode)->u).iAppend]);
      }
LAB_001b4986:
      jsonParseReset(&x);
    }
  }
  return;
}

Assistant:

static void jsonReplaceFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  u32 i;

  if( argc<1 ) return;
  if( (argc&1)==0 ) {
    jsonWrongNumArgs(ctx, "replace");
    return;
  }
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  assert( x.nNode );
  for(i=1; i<(u32)argc; i+=2){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    pNode = jsonLookup(&x, zPath, 0, ctx);
    if( x.nErr ) goto replace_err;
    if( pNode ){
      pNode->jnFlags |= (u8)JNODE_REPLACE;
      pNode->u.iReplace = i + 1;
    }
  }
  if( x.aNode[0].jnFlags & JNODE_REPLACE ){
    sqlite3_result_value(ctx, argv[x.aNode[0].u.iReplace]);
  }else{
    jsonReturnJson(x.aNode, ctx, argv);
  }
replace_err:
  jsonParseReset(&x);
}